

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_c989e::TransformActionToUpper::operator()
          (string *__return_storage_ptr__,TransformActionToUpper *this,string *s)

{
  TransformSelector *pTVar1;
  pointer pcVar2;
  int iVar3;
  
  pTVar1 = (this->super_TransformAction).Selector;
  iVar3 = (*(pTVar1->super_TransformSelector)._vptr_TransformSelector[4])(pTVar1,s);
  if ((char)iVar3 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + s->_M_string_length);
  }
  else {
    cmsys::SystemTools::UpperCase(__return_storage_ptr__,s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string& s) override
  {
    if (this->Selector->InSelection(s)) {
      return cmSystemTools::UpperCase(s);
    }

    return s;
  }